

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenerate.cpp
# Opt level: O1

void __thiscall
luna::CodeGenerateVisitor::Visit(CodeGenerateVisitor *this,TableIndexField *field,void *data)

{
  int table_register;
  SyntaxTree *pSVar1;
  int key_register;
  ExpVarData_conflict exp_var_data;
  
  table_register = *data;
  key_register = GenerateRegisterId(this);
  pSVar1 = (field->index_)._M_t.
           super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
           super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
           super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
  (*pSVar1->_vptr_SyntaxTree[2])(pSVar1,this);
  SetTableFieldValue<luna::TableIndexField>(this,field,table_register,key_register,field->line_);
  return;
}

Assistant:

void CodeGenerateVisitor::Visit(TableIndexField *field, void *data)
    {
        auto field_data = static_cast<TableFieldData *>(data);
        auto table_register = field_data->table_register_;

        // Load key
        auto key_register = GenerateRegisterId();
        ExpVarData exp_var_data{ key_register, key_register + 1 };
        field->index_->Accept(this, &exp_var_data);

        SetTableFieldValue(field, table_register, key_register, field->line_);
    }